

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

size_t __thiscall
asio::detail::reactive_socket_service_base::send<asio::const_buffers_1>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          const_buffers_1 *buffers,message_flags flags,error_code *ec)

{
  size_t sVar1;
  int in_ECX;
  const_buffers_1 *in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  error_code *in_R8;
  const_buffer local_48;
  const_buffer local_38;
  
  local_38 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first(in_RDX);
  const_buffer::data(&local_38);
  local_48 = buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::first(in_RDX);
  const_buffer::size(&local_48);
  sVar1 = socket_ops::sync_send1
                    ((socket_type)((ulong)in_RDI >> 0x20),(state_type)((ulong)in_RDI >> 0x18),in_RSI
                     ,(size_t)in_RDX,in_ECX,in_R8);
  return sVar1;
}

Assistant:

size_t send(base_implementation_type& impl,
      const ConstBufferSequence& buffers,
      socket_base::message_flags flags, asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    if (bufs_type::is_single_buffer)
    {
      return socket_ops::sync_send1(impl.socket_,
          impl.state_, bufs_type::first(buffers).data(),
          bufs_type::first(buffers).size(), flags, ec);
    }
    else
    {
      bufs_type bufs(buffers);
      return socket_ops::sync_send(impl.socket_, impl.state_,
          bufs.buffers(), bufs.count(), flags, bufs.all_empty(), ec);
    }
  }